

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.h
# Opt level: O0

void __thiscall
llvm::
formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
::formatv_object(formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
                 *this,StringRef Fmt,
                tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
                *Params)

{
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
  *t;
  llvm local_51;
  vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_> local_50;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
  *local_38;
  char *pcStack_30;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
  *local_28;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
  *Params_local;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
  *this_local;
  StringRef Fmt_local;
  
  pcStack_30 = (char *)Fmt.Length;
  local_38 = (formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
              *)Fmt.Data;
  t = (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
       *)0x3;
  local_28 = Params;
  Params_local = (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
                  *)this;
  this_local = local_38;
  Fmt_local.Data = pcStack_30;
  formatv_object_base::formatv_object_base(&this->super_formatv_object_base,Fmt,3);
  std::
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
  ::tuple(&this->Parameters,local_28);
  apply_tuple<llvm::formatv_object_base::create_adapters,std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,llvm::detail::provider_format_adapter<unsigned_int>,llvm::detail::provider_format_adapter<llvm::StringRef&>>&>
            (&local_50,&local_51,(create_adapters *)&this->Parameters,t);
  std::vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>::
  operator=(&(this->super_formatv_object_base).Adapters,&local_50);
  std::vector<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>::
  ~vector(&local_50);
  return;
}

Assistant:

formatv_object(StringRef Fmt, Tuple &&Params)
      : formatv_object_base(Fmt, std::tuple_size<Tuple>::value),
        Parameters(std::move(Params)) {
    Adapters = apply_tuple(create_adapters(), Parameters);
  }